

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

void __thiscall
pybind11::detail::function_call::function_call(function_call *this,function_record *f,handle p)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 *__n;
  vector<bool,_std::allocator<bool>_> *this_00;
  size_type in_stack_ffffffffffffffd8;
  vector<pybind11::handle,_std::allocator<pybind11::handle>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RSI;
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::vector
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)0x1520b3);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1520c6);
  __n = in_RDI + 9;
  object::object((object *)0x1520d9);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 10);
  object::object((object *)0x1520ec);
  in_RDI[0xb] = in_RDX;
  pybind11::handle::handle((handle *)(in_RDI + 0xc));
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<bool,_std::allocator<bool>_>::reserve(this_00,(size_type)__n);
  return;
}

Assistant:

inline function_call::function_call(const function_record &f, handle p) :
        func(f), parent(p) {
    args.reserve(f.nargs);
    args_convert.reserve(f.nargs);
}